

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void neon_store_reg(TCGContext_conflict1 *tcg_ctx,int reg,int pass,TCGv_i32 var)

{
  TCGv_ptr arg2;
  long offset;
  TCGv_i32 var_local;
  int pass_local;
  int reg_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  arg2 = tcg_ctx->cpu_env;
  offset = neon_reg_offset(reg,pass);
  tcg_gen_st_i32(tcg_ctx,var,arg2,offset);
  tcg_temp_free_i32(tcg_ctx,var);
  return;
}

Assistant:

static void neon_store_reg(TCGContext *tcg_ctx, int reg, int pass, TCGv_i32 var)
{
    tcg_gen_st_i32(tcg_ctx, var, tcg_ctx->cpu_env, neon_reg_offset(reg, pass));
    tcg_temp_free_i32(tcg_ctx, var);
}